

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

_Bool ggml_is_contiguous_n(ggml_tensor *tensor,int n)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  if ((tensor->ne[0] != type_traits[tensor->type].blck_size) &&
     (tensor->nb[0] != type_traits[tensor->type].type_size)) {
    return false;
  }
  sVar2 = (tensor->ne[0] / type_traits[tensor->type].blck_size) *
          type_traits[tensor->type].type_size;
  lVar3 = 0;
  do {
    lVar4 = lVar3 + 1;
    lVar1 = tensor->ne[lVar3 + 1];
    if (lVar1 != 1) {
      if (n < lVar4) {
        if (tensor->nb[lVar3 + 1] != sVar2) {
          return false;
        }
        sVar2 = sVar2 * lVar1;
      }
      else {
        sVar2 = tensor->nb[lVar3 + 1] * lVar1;
      }
    }
    lVar3 = lVar4;
  } while (lVar4 != 3);
  return true;
}

Assistant:

static bool ggml_is_contiguous_n(const struct ggml_tensor * tensor, int n) {
    size_t next_nb = ggml_type_size(tensor->type);
    if (tensor->ne[0] != ggml_blck_size(tensor->type) && tensor->nb[0] != next_nb) {
        return false;
    }
    next_nb *= tensor->ne[0]/ggml_blck_size(tensor->type);
    for (int i = 1; i < GGML_MAX_DIMS; i++) {
        if (tensor->ne[i] != 1) {
            if (i > n) {
                if (tensor->nb[i] != next_nb) {
                    return false;
                }
                next_nb *= tensor->ne[i];
            } else {
                // this dimension does not need to be contiguous
                next_nb = tensor->ne[i]*tensor->nb[i];
            }
        }
    }
    return true;
}